

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseExternalEntity
              (xmlDocPtr doc,xmlSAXHandlerPtr sax,void *user_data,int depth,xmlChar *URL,xmlChar *ID
              ,xmlNodePtr *list)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  
  if (list != (xmlNodePtr *)0x0) {
    *list = (xmlNodePtr)0x0;
  }
  if (doc == (xmlDocPtr)0x0) {
    iVar1 = 0x73;
  }
  else {
    ctxt = xmlNewSAXParserCtxt(sax,user_data);
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      iVar1 = 2;
    }
    else {
      ctxt->depth = depth;
      ctxt->myDoc = doc;
      iVar1 = xmlParseCtxtExternalEntity(ctxt,URL,ID,list);
      xmlFreeParserCtxt(ctxt);
    }
  }
  return iVar1;
}

Assistant:

int
xmlParseExternalEntity(xmlDocPtr doc, xmlSAXHandlerPtr sax, void *user_data,
	  int depth, const xmlChar *URL, const xmlChar *ID, xmlNodePtr *list) {
    xmlParserCtxtPtr ctxt;
    int ret;

    if (list != NULL)
        *list = NULL;

    if (doc == NULL)
        return(XML_ERR_ARGUMENT);

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    ctxt->depth = depth;
    ctxt->myDoc = doc;
    ret = xmlParseCtxtExternalEntity(ctxt, URL, ID, list);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}